

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_location.hpp
# Opt level: O0

basic_json_location<char,_std::allocator<char>_> *
jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>::parse
          (basic_string_view<char,_std::char_traits<char>_> *normalized_path)

{
  json_location_parser<char,_std::allocator<char>_> *in_RDI;
  vector<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  location;
  json_location_parser<char,_std::allocator<char>_> parser;
  allocator_type *in_stack_ffffffffffffff78;
  json_location_parser<char,_std::allocator<char>_> *this;
  allocator<char> *this_00;
  allocator<char> local_39 [9];
  string_view_type *in_stack_ffffffffffffffd0;
  json_location_parser<char,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  this_00 = local_39;
  this = in_RDI;
  std::allocator<char>::allocator();
  detail::json_location_parser<char,_std::allocator<char>_>::json_location_parser
            (this,in_stack_ffffffffffffff78);
  std::allocator<char>::~allocator(local_39);
  detail::json_location_parser<char,_std::allocator<char>_>::parse
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  basic_json_location((basic_json_location<char,_std::allocator<char>_> *)this,
                      (vector<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffff78);
  std::
  vector<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  ::~vector((vector<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
             *)this_00);
  detail::json_location_parser<char,_std::allocator<char>_>::~json_location_parser
            ((json_location_parser<char,_std::allocator<char>_> *)0x5f8cf6);
  return (basic_json_location<char,_std::allocator<char>_> *)in_RDI;
}

Assistant:

static basic_json_location parse(const jsoncons::basic_string_view<char_type>& normalized_path)
        {
            jsonpath::detail::json_location_parser<char,std::allocator<char>> parser;

            std::vector<value_type> location = parser.parse(normalized_path);
            return basic_json_location(std::move(location));
        }